

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::replaceLaneI8x16
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,uint8_t index)

{
  reference this_00;
  undefined3 in_register_00000009;
  undefined1 local_1a8 [8];
  LaneArray<16> lanes;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_1a8,(wasm *)this,other);
  this_00 = std::array<wasm::Literal,_16UL>::at
                      ((LaneArray<16> *)local_1a8,(ulong)CONCAT31(in_register_00000009,index));
  if (this_00 != other) {
    ~Literal(this_00);
    Literal(this_00,other);
  }
  Literal(__return_storage_ptr__,(LaneArray<16> *)local_1a8);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::replaceLaneI8x16(const Literal& other, uint8_t index) const {
  return replace<16, &Literal::getLanesUI8x16>(*this, other, index);
}